

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hdr_t * bcf_hdr_read(htsFile *hfp)

{
  kstring_t *str;
  bool bVar1;
  int iVar2;
  int iVar3;
  bcf_hdr_t *pbVar4;
  ssize_t sVar5;
  char *pcVar6;
  BGZF *pBVar7;
  kstream_t *ks;
  long lVar8;
  tbx_t *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar9;
  char *pcVar10;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  kstring_t *dret;
  uchar *puVar14;
  size_t sVar15;
  undefined1 auStack_6c [20];
  char *pcStack_58;
  kstring_t kStack_48;
  uint8_t magic [5];
  int hlen;
  
  if ((hfp->format).format != vcf) {
    pBVar7 = (hfp->fp).bgzf;
    kStack_48.m = 0x112c45;
    pbVar4 = bcf_hdr_init("r");
    kStack_48.m = 0x112c58;
    sVar5 = bgzf_read(pBVar7,magic,5);
    if (sVar5 < 0) {
      pbVar4 = (bcf_hdr_t *)0x0;
      kStack_48.m = 0x112d2f;
      fprintf(_stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
              ,0x2f1,"bcf_hdr_read");
    }
    else {
      kStack_48.m = 0x112c75;
      iVar2 = bcmp(magic,"BCF\x02\x02",5);
      if (iVar2 == 0) {
        kStack_48.m = 0x112cc4;
        bgzf_read(pBVar7,&hlen,4);
        kStack_48.m = 0x112ccf;
        pcVar6 = (char *)malloc((long)hlen);
        kStack_48.m = 0x112ce0;
        bgzf_read(pBVar7,pcVar6,(long)hlen);
        kStack_48.m = 0x112ceb;
        bcf_hdr_parse(pbVar4,pcVar6);
        kStack_48.m = 0x112cf3;
        free(pcVar6);
      }
      else {
        kStack_48.m = 0x112c8d;
        iVar2 = bcmp(magic,"BCF",3);
        if (iVar2 == 0) {
          kStack_48.m = 0x112d5c;
          fprintf(_stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                  ,0x2f7,"bcf_hdr_read");
        }
        else if (1 < hts_verbose) {
          kStack_48.m = 0x112d80;
          fprintf(_stderr,"[E::%s] invalid BCF2 magic string\n","bcf_hdr_read");
        }
        kStack_48.m = 0x112cad;
        bcf_hdr_destroy(pbVar4);
        pbVar4 = (bcf_hdr_t *)0x0;
      }
    }
    return pbVar4;
  }
  str = &hfp->line;
  pbVar4 = bcf_hdr_init("r");
  kStack_48.s = (char *)0x0;
  kStack_48.l = 0;
  kStack_48.m = 0;
  iVar2 = (int)auStack_6c + 4;
  do {
    do {
      iVar3 = hts_getline(hfp,2,str);
      if (iVar3 < 0) goto LAB_00112f74;
      sVar15 = str->l;
    } while (sVar15 == 0);
    pcVar6 = (hfp->line).s;
    if (*pcVar6 != '#') {
      if (1 < hts_verbose) {
        fprintf(_stderr,"[E::%s] no sample line\n","vcf_hdr_read");
      }
      free(kStack_48.s);
      bcf_hdr_destroy(pbVar4);
      return (bcf_hdr_t *)0x0;
    }
    if ((pcVar6[1] != '#') && (hfp->fn_aux != (char *)0x0)) {
      auStack_6c._4_8_ = 0;
      auStack_6c._12_8_ = 0;
      pcStack_58 = (char *)0x0;
      dret = str;
      pBVar7 = (BGZF *)gzopen(hfp->fn_aux,"r");
      ks = ks_init(pBVar7);
LAB_00112e45:
      iVar3 = ks_getuntil((kstream_t_conflict *)ks,iVar2,(kstring_t *)auStack_6c,(int *)dret);
      if (-1 < iVar3) {
        kputs("##contig=<ID=",&kStack_48);
        kputs(pcStack_58,&kStack_48);
        ks_getuntil((kstream_t_conflict *)ks,iVar2,(kstring_t *)auStack_6c,(int *)dret);
        kputs(",length=",&kStack_48);
        lVar8 = atol(pcStack_58);
        kputw((int)lVar8,&kStack_48);
        kputsn(">\n",2,&kStack_48);
        if (auStack_6c._0_4_ != 10) {
          dret = (kstring_t *)(ulong)(uint)ks->begin;
          iVar3 = ks->end;
          do {
            if (((*(uint *)&ks->field_0x8 & 3) != 0) && (iVar3 <= (int)dret)) break;
            puVar14 = ks->buf;
            if (iVar3 <= (int)dret) {
              ks->begin = 0;
              iVar3 = gzread(ks->f,puVar14,(int)*(uint *)&ks->field_0x8 >> 2);
              ks->end = iVar3;
              if (iVar3 == 0) {
                *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                break;
              }
              dret = (kstring_t *)(ulong)(uint)ks->begin;
              puVar14 = ks->buf;
            }
            ks->seek_pos = ks->seek_pos + 1;
            iVar12 = (int)dret;
            uVar13 = iVar12 + 1;
            dret = (kstring_t *)(ulong)uVar13;
            ks->begin = uVar13;
          } while (puVar14[iVar12] != '\n');
        }
        goto LAB_00112e45;
      }
      free(pcStack_58);
      ks_destroy(ks);
      gzclose(pBVar7);
      sVar15 = (hfp->line).l;
      pcVar6 = (hfp->line).s;
    }
    kputsn(pcVar6,(int)sVar15,&kStack_48);
    kputc(10,&kStack_48);
  } while ((hfp->line).s[1] == '#');
LAB_00112f74:
  pcVar6 = kStack_48.s;
  if (kStack_48.s == (char *)0x0) {
    pbVar4 = (bcf_hdr_t *)0x0;
    fprintf(_stderr,"[%s:%d %s] Could not read the header\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
            ,0x4db,"vcf_hdr_read");
  }
  else {
    bcf_hdr_parse(pbVar4,kStack_48.s);
    tbx = tbx_index_load(hfp->fn);
    if (tbx != (tbx_t *)0x0) {
      __ptr = tbx_seqnames(tbx,(int *)(auStack_6c + 4));
      bVar1 = false;
      for (lVar8 = 0; lVar8 < (int)auStack_6c._4_4_; lVar8 = lVar8 + 1) {
        pbVar9 = bcf_hdr_get_hrec(pbVar4,3,"ID",__ptr[lVar8],(char *)0x0);
        if (pbVar9 == (bcf_hrec_t *)0x0) {
          pbVar9 = (bcf_hrec_t *)calloc(1,0x30);
          pcVar10 = strdup("contig");
          pbVar9->key = pcVar10;
          bcf_hrec_add_key(pbVar9,"ID",2);
          iVar2 = pbVar9->nkeys;
          pcVar10 = __ptr[lVar8];
          sVar11 = strlen(pcVar10);
          bcf_hrec_set_val(pbVar9,iVar2 + -1,pcVar10,(int)sVar11,0);
          bcf_hdr_add_hrec(pbVar4,pbVar9);
          bVar1 = true;
        }
      }
      free(__ptr);
      tbx_destroy(tbx);
      if (bVar1) {
        bcf_hdr_sync(pbVar4);
      }
    }
    free(pcVar6);
  }
  return pbVar4;
}

Assistant:

bcf_hdr_t *bcf_hdr_read(htsFile *hfp)
{
    if (hfp->format.format == vcf)
        return vcf_hdr_read(hfp);

    BGZF *fp = hfp->fp.bgzf;
    uint8_t magic[5];
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    if ( bgzf_read(fp, magic, 5)<0 )
    {
        fprintf(stderr,"[%s:%d %s] Failed to read the header (reading BCF in text mode?)\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    if (strncmp((char*)magic, "BCF\2\2", 5) != 0)
    {
        if (!strncmp((char*)magic, "BCF", 3))
            fprintf(stderr,"[%s:%d %s] invalid BCF2 magic string: only BCFv2.2 is supported.\n", __FILE__,__LINE__,__FUNCTION__);
        else if (hts_verbose >= 2)
            fprintf(stderr, "[E::%s] invalid BCF2 magic string\n", __func__);
        bcf_hdr_destroy(h);
        return 0;
    }
    int hlen;
    char *htxt;
    bgzf_read(fp, &hlen, 4);
    htxt = (char*)malloc(hlen);
    bgzf_read(fp, htxt, hlen);
    bcf_hdr_parse(h, htxt);
    free(htxt);
    return h;
}